

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_type_pattern(lysp_yang_ctx *ctx,lysp_restr **patterns)

{
  long *plVar1;
  lysp_restr *plVar2;
  lyd_node *plVar3;
  size_t __n;
  LY_ERR LVar4;
  long *plVar5;
  char *pcVar6;
  lysp_ext_instance **pplVar7;
  char *format;
  ly_stmt parent_stmt;
  uint16_t *flags;
  ly_ctx *plVar8;
  lysp_ext_instance *plVar9;
  lysp_ext_instance *plVar10;
  long lVar11;
  lysp_ext_instance **exts;
  ly_stmt kw;
  char *word;
  size_t word_len;
  lysp_ext_instance **in_stack_ffffffffffffff90;
  ly_stmt local_64;
  char *local_60;
  size_t local_58;
  char *local_50;
  lysp_ext_instance **local_48;
  lysp_ext_instance **local_40;
  lysp_ext_instance **local_38;
  
  plVar2 = *patterns;
  if (plVar2 == (lysp_restr *)0x0) {
    plVar5 = (long *)malloc(0x48);
    if (plVar5 == (long *)0x0) goto LAB_0017f184;
    *plVar5 = 1;
    lVar11 = 1;
  }
  else {
    plVar9 = (lysp_ext_instance *)((long)&(plVar2[-1].exts)->name + 1);
    plVar2[-1].exts = plVar9;
    plVar5 = (long *)realloc(&plVar2[-1].exts,(long)plVar9 * 0x40 | 8);
    if (plVar5 == (long *)0x0) {
      (*patterns)[-1].exts = (lysp_ext_instance *)((long)&(*patterns)[-1].exts[-1].exts + 7);
      goto LAB_0017f184;
    }
    lVar11 = *plVar5;
  }
  *patterns = (lysp_restr *)(plVar5 + 1);
  plVar1 = plVar5 + lVar11 * 8;
  flags = (uint16_t *)(plVar1 + -5);
  plVar1[-1] = 0;
  *plVar1 = 0;
  plVar1[-3] = 0;
  plVar1[-2] = 0;
  flags[0] = 0;
  flags[1] = 0;
  flags[2] = 0;
  flags[3] = 0;
  plVar1[-4] = 0;
  plVar1[-7] = 0;
  plVar1[-6] = 0;
  LVar4 = get_argument(ctx,Y_STR_ARG,flags,&local_60,&local_50,&local_58);
  __n = local_58;
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  if (local_50 == (char *)0x0) {
    local_50 = (char *)malloc(local_58 + 2);
  }
  else {
    local_50 = (char *)ly_realloc(local_50,local_58 + 2);
    local_60 = local_50;
  }
  if (local_50 != (char *)0x0) {
    if (__n != 0) {
      memmove(local_50 + 1,local_60,__n);
    }
    plVar9 = (lysp_ext_instance *)(plVar5 + lVar11 * 8 + -7);
    *local_50 = '\x06';
    local_50[__n + 1] = '\0';
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar4 = lydict_insert_zc(plVar8,local_50,(char **)plVar9);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    exts = (lysp_ext_instance **)(plVar5 + lVar11 * 8);
    exts[-6] = (lysp_ext_instance *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    LVar4 = get_keyword(ctx,&local_64,&local_60,&local_58);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    if (local_64 == LY_STMT_SYNTAX_SEMICOLON) {
      return LY_SUCCESS;
    }
    if (local_64 != LY_STMT_SYNTAX_LEFT_BRACE) {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      pcVar6 = lyplg_ext_stmt2str(local_64);
      ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\", expected \";\" or \"{\"."
              ,pcVar6);
      return LY_EVALID;
    }
    LVar4 = get_keyword(ctx,&local_64,&local_60,&local_58);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    if (local_64 == LY_STMT_SYNTAX_RIGHT_BRACE) {
      return LY_SUCCESS;
    }
    local_38 = exts + -4;
    local_40 = exts + -3;
    local_48 = exts + -1;
    do {
      if ((int)local_64 < 0xf0000) {
        if (local_64 == LY_STMT_DESCRIPTION) {
          plVar10 = exts[-2];
          parent_stmt = LY_STMT_DESCRIPTION;
          pplVar7 = exts + -2;
        }
        else {
          plVar10 = plVar9;
          if (local_64 == LY_STMT_ERROR_APP_TAG) {
            parent_stmt = LY_STMT_ERROR_APP_TAG;
            pplVar7 = local_40;
          }
          else {
            if (local_64 != LY_STMT_ERROR_MESSAGE) {
LAB_0017f436:
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar8 = (ly_ctx *)0x0;
              }
              else {
                plVar8 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar6 = lyplg_ext_stmt2str(local_64);
              format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_0017f49a:
              ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6,"pattern");
              return LY_EVALID;
            }
            parent_stmt = LY_STMT_ERROR_MESSAGE;
            pplVar7 = local_38;
          }
        }
LAB_0017f35c:
        LVar4 = parse_text_field(ctx,plVar10,parent_stmt,(uint32_t)pplVar7,(char **)0x2,
                                 Y_IDENTIF_ARG,(uint16_t *)exts,in_stack_ffffffffffffff90);
      }
      else if (local_64 == LY_STMT_EXTENSION_INSTANCE) {
        LVar4 = parse_ext(ctx,local_60,local_58,plVar9,LY_STMT_PATTERN,0,exts);
      }
      else {
        if (local_64 != LY_STMT_MODIFIER) {
          if (local_64 != LY_STMT_REFERENCE) goto LAB_0017f436;
          plVar10 = *local_48;
          parent_stmt = LY_STMT_REFERENCE;
          pplVar7 = local_48;
          goto LAB_0017f35c;
        }
        plVar3 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        if (*(byte *)&plVar3[2].schema < 2) {
          plVar8 = (ly_ctx *)**(undefined8 **)plVar3;
          format = 
          "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
          ;
          pcVar6 = "modifier";
          goto LAB_0017f49a;
        }
        LVar4 = parse_type_pattern_modifier(ctx,(lysp_restr *)plVar9);
      }
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      LVar4 = get_keyword(ctx,&local_64,&local_60,&local_58);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      if (local_64 == LY_STMT_SYNTAX_RIGHT_BRACE) {
        if ((*exts != (lysp_ext_instance *)0x0) &&
           (LVar4 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
           LVar4 != LY_SUCCESS)) {
          return LVar4;
        }
        return LY_SUCCESS;
      }
    } while( true );
  }
LAB_0017f184:
  if (ctx == (lysp_yang_ctx *)0x0) {
    plVar8 = (ly_ctx *)0x0;
  }
  else {
    plVar8 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_type_pattern");
  return LY_EMEM;
}

Assistant:

static LY_ERR
parse_type_pattern(struct lysp_yang_ctx *ctx, struct lysp_restr **patterns)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_restr *restr;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *patterns, restr, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, &restr->arg.flags, &word, &buf, &word_len));

    /* add special meaning first byte */
    if (buf) {
        buf = ly_realloc(buf, word_len + 2);
        word = buf;
    } else {
        buf = malloc(word_len + 2);
    }
    LY_CHECK_ERR_RET(!buf, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);
    if (word_len) {
        memmove(buf + 1, word, word_len);
    }
    buf[0] = LYSP_RESTR_PATTERN_ACK; /* pattern's default regular-match flag */
    buf[word_len + 1] = '\0'; /* terminating NULL byte */
    LY_CHECK_RET(lydict_insert_zc(PARSER_CTX(ctx), buf, &restr->arg.str));
    restr->arg.mod = PARSER_CUR_PMOD(ctx);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, restr->dsc, LY_STMT_DESCRIPTION, 0, &restr->dsc, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, restr->ref, LY_STMT_REFERENCE, 0, &restr->ref, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_ERROR_APP_TAG:
            LY_CHECK_RET(parse_text_field(ctx, restr, LY_STMT_ERROR_APP_TAG, 0, &restr->eapptag, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_ERROR_MESSAGE:
            LY_CHECK_RET(parse_text_field(ctx, restr, LY_STMT_ERROR_MESSAGE, 0, &restr->emsg, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_MODIFIER:
            PARSER_CHECK_STMTVER2_RET(ctx, "modifier", "pattern");
            LY_CHECK_RET(parse_type_pattern_modifier(ctx, restr));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, restr, LY_STMT_PATTERN, 0, &restr->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "pattern");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, restr->exts, ret, cleanup);
    }

cleanup:
    return ret;
}